

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fftheap(fitsfile *fptr,LONGLONG *heapsz,LONGLONG *unused,LONGLONG *overlap,int *valid,
           int *status)

{
  bool bVar1;
  int iVar2;
  void *__ptr;
  char local_f8 [8];
  char message [81];
  char *buffer;
  LONGLONG toverlap;
  LONGLONG tunused;
  LONGLONG offset;
  LONGLONG repeat;
  long nbytes;
  long theapsz;
  long kk;
  long ii;
  int local_48;
  int pixsize;
  int typecode;
  int jj;
  int *status_local;
  int *valid_local;
  LONGLONG *overlap_local;
  LONGLONG *unused_local;
  LONGLONG *heapsz_local;
  fitsfile *fptr_local;
  
  toverlap = 0;
  buffer = (char *)0x0;
  if (*status < 1) {
    _typecode = status;
    status_local = valid;
    valid_local = (int *)overlap;
    overlap_local = unused;
    unused_local = heapsz;
    heapsz_local = (LONGLONG *)fptr;
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      iVar2 = ffrdef(fptr,status);
      if (0 < iVar2) {
        return *_typecode;
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (status_local != (int *)0x0) {
      *status_local = 1;
    }
    if (unused_local != (LONGLONG *)0x0) {
      *unused_local = *(LONGLONG *)(heapsz_local[1] + 0x3e0);
    }
    if (overlap_local != (LONGLONG *)0x0) {
      *overlap_local = 0;
    }
    if (valid_local != (int *)0x0) {
      valid_local[0] = 0;
      valid_local[1] = 0;
    }
    if ((*(int *)(heapsz_local[1] + 0x58) == 2) && (*(long *)(heapsz_local[1] + 0x3e0) != 0)) {
      if (*(long *)(heapsz_local[1] + 0x3e0) <= 0x7fffffffffffffff) {
        nbytes = *(size_t *)(heapsz_local[1] + 0x3e0);
        __ptr = calloc(1,nbytes);
        if (__ptr == (void *)0x0) {
          snprintf(local_f8,0x51,"Failed to allocate buffer to test the heap");
          ffpmsg(local_f8);
          *_typecode = 0x71;
          fptr_local._4_4_ = 0x71;
        }
        else {
          pixsize = 1;
          while( true ) {
            bVar1 = false;
            if (pixsize <= *(int *)(heapsz_local[1] + 0x3b0)) {
              bVar1 = *_typecode < 1;
            }
            if (!bVar1) break;
            ffgtcl((fitsfile *)heapsz_local,pixsize,&local_48,(long *)0x0,(long *)0x0,_typecode);
            if (local_48 < 1) {
              ii._4_4_ = -local_48 / 10;
              for (kk = 1; kk <= *(long *)(heapsz_local[1] + 0x3c0); kk = kk + 1) {
                ffgdesll((fitsfile *)heapsz_local,pixsize,kk,&offset,&tunused,_typecode);
                if (local_48 == -1) {
                  repeat = (offset + 7) / 8;
                }
                else {
                  repeat = offset * ii._4_4_;
                }
                if ((tunused < 0) || (nbytes < tunused + repeat)) {
                  if (status_local != (int *)0x0) {
                    *status_local = 0;
                  }
                  snprintf(local_f8,0x51,"Descriptor in row %ld, column %d has invalid heap address"
                           ,kk,(ulong)(uint)pixsize);
                  ffpmsg(local_f8);
                }
                else {
                  for (theapsz = 0; theapsz < repeat; theapsz = theapsz + 1) {
                    *(char *)((long)__ptr + theapsz + tunused) =
                         *(char *)((long)__ptr + theapsz + tunused) + '\x01';
                  }
                }
              }
            }
            pixsize = pixsize + 1;
          }
          for (theapsz = 0; theapsz < nbytes; theapsz = theapsz + 1) {
            if (*(char *)((long)__ptr + theapsz) == '\0') {
              toverlap = toverlap + 1;
            }
            else if ('\x01' < *(char *)((long)__ptr + theapsz)) {
              buffer = buffer + 1;
            }
          }
          if (unused_local != (LONGLONG *)0x0) {
            *unused_local = nbytes;
          }
          if (overlap_local != (LONGLONG *)0x0) {
            *overlap_local = toverlap;
          }
          if (valid_local != (int *)0x0) {
            *(char **)valid_local = buffer;
          }
          free(__ptr);
          fptr_local._4_4_ = *_typecode;
        }
      }
      else {
        ffpmsg("Heap is too big to test ( > 2**31 bytes). (fftheap)");
        *_typecode = 0x71;
        fptr_local._4_4_ = 0x71;
      }
    }
    else {
      fptr_local._4_4_ = *_typecode;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int fftheap(fitsfile *fptr, /* I - FITS file pointer                         */
           LONGLONG *heapsz,   /* O - current size of the heap               */
           LONGLONG *unused,   /* O - no. of unused bytes in the heap        */
           LONGLONG *overlap,  /* O - no. of bytes shared by > 1 descriptors */
           int  *valid,     /* O - are all the heap addresses valid?         */
           int *status)     /* IO - error status                             */
/*
  Tests the contents of the binary table variable length array heap.
  Returns the number of bytes that are currently not pointed to by any
  of the descriptors, and also the number of bytes that are pointed to
  by more than one descriptor.  It returns valid = FALSE if any of the
  descriptors point to addresses that are out of the bounds of the
  heap.
*/
{
    int jj, typecode, pixsize;
    long ii, kk, theapsz, nbytes;
    LONGLONG repeat, offset, tunused = 0, toverlap = 0;
    char *buffer, message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if ( fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header to make sure everything is up to date */
    else if ( ffrdef(fptr, status) > 0)               
        return(*status);

    if (valid) *valid = TRUE;
    if (heapsz) *heapsz = (fptr->Fptr)->heapsize;
    if (unused) *unused = 0;
    if (overlap) *overlap = 0;
    
    /* return if this is not a binary table HDU or if the heap is empty */
    if ( (fptr->Fptr)->hdutype != BINARY_TBL || (fptr->Fptr)->heapsize == 0 )
        return(*status);

    if ((fptr->Fptr)->heapsize > LONG_MAX) {
        ffpmsg("Heap is too big to test ( > 2**31 bytes). (fftheap)");
        return(*status = MEMORY_ALLOCATION);
    }

    theapsz = (long) (fptr->Fptr)->heapsize;
    buffer = calloc(1, theapsz);     /* allocate temp space */
    if (!buffer )
    {
        snprintf(message,FLEN_ERRMSG,"Failed to allocate buffer to test the heap");
        ffpmsg(message);
        return(*status = MEMORY_ALLOCATION);
    }

    /* loop over all cols */
    for (jj = 1; jj <= (fptr->Fptr)->tfield && *status <= 0; jj++)
    {
        ffgtcl(fptr, jj, &typecode, NULL, NULL, status);
        if (typecode > 0)
           continue;        /* ignore fixed length columns */

        pixsize = -typecode / 10;

        for (ii = 1; ii <= (fptr->Fptr)->numrows; ii++)
        {
            ffgdesll(fptr, jj, ii, &repeat, &offset, status);
            if (typecode == -TBIT)
                nbytes = (long) (repeat + 7) / 8;
            else
                nbytes = (long) repeat * pixsize;

            if (offset < 0 || offset + nbytes > theapsz)
            {
                if (valid) *valid = FALSE;  /* address out of bounds */
                snprintf(message,FLEN_ERRMSG,
                "Descriptor in row %ld, column %d has invalid heap address",
                ii, jj);
                ffpmsg(message);
            }
            else
            {
                for (kk = 0; kk < nbytes; kk++)
                    buffer[kk + offset]++;   /* increment every used byte */
            }
        }
    }

    for (kk = 0; kk < theapsz; kk++)
    {
        if (buffer[kk] == 0)
            tunused++;
        else if (buffer[kk] > 1)
            toverlap++;
    }

    if (heapsz) *heapsz = theapsz;
    if (unused) *unused = tunused;
    if (overlap) *overlap = toverlap;

    free(buffer);
    return(*status);
}